

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  cmCPackIFWCommon *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  cmCPackLog *pcVar3;
  string *psVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *r;
  string *repositoryName;
  string sysName;
  string BinCreatorOpt;
  string FrameworkVersionOpt;
  string RepoGenOpt;
  string exeSuffix;
  undefined1 local_258 [47];
  allocator<char> local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"CPACK_IFW_BINARYCREATOR_EXECUTABLE","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"CPACK_IFW_REPOGEN_EXECUTABLE","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"CPACK_IFW_FRAMEWORK_VERSION","");
  bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_208);
  if (((!bVar6) ||
      (bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1c8), !bVar6)) ||
     (bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1e8), !bVar6)) {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  this_00 = &this->super_cmCPackIFWCommon;
  pcVar8 = cmCPackIFWCommon::GetOption(this_00,&local_208);
  if ((pcVar8 == (char *)0x0) || (bVar6 = cmSystemTools::IsNOTFOUND((char *)0x1669f1), bVar6)) {
    (this->BinCreator)._M_string_length = 0;
    *(this->BinCreator)._M_dataplus._M_p = '\0';
  }
  else {
    pcVar9 = (char *)(this->BinCreator)._M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)&this->BinCreator,0,pcVar9,(ulong)pcVar8);
  }
  if ((this->BinCreator)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
               ,0x5b);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      uVar5 = local_258._0_8_;
      sVar10 = strlen((char *)local_258._0_8_);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x10a,(char *)uVar5,sVar10);
LAB_001670bd:
      if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
    }
  }
  else {
    pcVar8 = cmCPackIFWCommon::GetOption(this_00,&local_1c8);
    if ((pcVar8 == (char *)0x0) || (bVar6 = cmSystemTools::IsNOTFOUND((char *)0x166a5f), bVar6)) {
      (this->RepoGen)._M_string_length = 0;
      *(this->RepoGen)._M_dataplus._M_p = '\0';
    }
    else {
      pcVar9 = (char *)(this->RepoGen)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->RepoGen,0,pcVar9,(ulong)pcVar8);
    }
    pcVar9 = cmCPackIFWCommon::GetOption(this_00,&local_1e8);
    pcVar8 = (char *)(this->FrameworkVersion)._M_string_length;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "1.9.9";
    }
    else {
      strlen(pcVar9);
    }
    std::__cxx11::string::_M_replace((ulong)&this->FrameworkVersion,0,pcVar8,(ulong)pcVar9);
    pp_Var2 = (_func_int **)(local_1a8 + 0x10);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES","");
    bVar6 = cmCPackIFWCommon::IsOn(this_00,(string *)local_1a8);
    this->ResolveDuplicateNames = bVar6;
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->PkgsDirsVector,
                      (this->PkgsDirsVector).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_PACKAGES_DIRECTORIES","");
    pcVar8 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1a8._0_8_ = pp_Var2;
      sVar10 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar8,pcVar8 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&this->PkgsDirsVector,false);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->RepoDirsVector,
                      (this->RepoDirsVector).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_REPOSITORIES_DIRECTORIES","");
    pcVar8 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1a8._0_8_ = pp_Var2;
      sVar10 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar8,pcVar8 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&this->RepoDirsVector,false);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
    }
    (this->Installer).super_cmCPackIFWCommon.Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    (this->Repository).super_cmCPackIFWCommon.Generator = this;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->Repository).Name,0,(char *)(this->Repository).Name._M_string_length,
               0x4d1807);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_DOWNLOAD_SITE","");
    pcVar8 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar9 = (char *)(this->Repository).Url._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&(this->Repository).Url,0,pcVar9,(ulong)pcVar8);
      local_1a8._0_8_ = &this->Repository;
      std::vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>>::
      emplace_back<cmCPackIFWRepository*>
                ((vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>> *)
                 &(this->Installer).RemoteRepositories,(cmCPackIFWRepository **)local_1a8);
    }
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_REPOSITORIES_ALL","");
    pcVar8 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_258._0_8_ = (string *)0x0;
      local_258._8_8_ = (string *)0x0;
      local_258._16_8_ = (pointer)0x0;
      local_1a8._0_8_ = pp_Var2;
      sVar10 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar8,pcVar8 + sVar10);
      cmSystemTools::ExpandListArgument
                ((string *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258,false);
      repositoryName = (string *)local_258._0_8_;
      psVar4 = (string *)local_258._8_8_;
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        repositoryName = (string *)local_258._0_8_;
        psVar4 = (string *)local_258._8_8_;
      }
      for (; repositoryName != psVar4; repositoryName = repositoryName + 1) {
        GetRepository(this,repositoryName);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258);
    }
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_DOWNLOAD_ALL","")
    ;
    pcVar8 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar8 == (char *)0x0) {
      local_1a8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_DOWNLOAD_ALL","");
      pcVar8 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      if (pcVar8 != (char *)0x0) {
        bVar6 = cmSystemTools::IsOn(pcVar8);
        goto LAB_00166fec;
      }
      this->OnlineOnly = false;
    }
    else {
      bVar6 = cmSystemTools::IsOn(pcVar8);
LAB_00166fec:
      this->OnlineOnly = bVar6;
    }
    if (((this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_start ==
         (this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_finish) || ((this->RepoGen)._M_string_length != 0)) {
      psVar4 = (string *)(local_258 + 0x10);
      local_258._0_8_ = psVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,"CMAKE_EXECUTABLE_SUFFIX","");
      pcVar8 = cmCPackIFWCommon::GetOption(this_00,(string *)local_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar8,(allocator<char> *)&local_228);
      if ((string *)local_258._0_8_ != psVar4) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      paVar1 = &local_228.field_2;
      local_228._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"CMAKE_SYSTEM_NAME","");
      pcVar8 = cmCPackIFWCommon::GetOption(this_00,&local_228);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_258,pcVar8,&local_229);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      iVar7 = std::__cxx11::string::compare(local_258);
      if (iVar7 == 0) {
        pcVar8 = ".run";
LAB_0016722d:
        std::__cxx11::string::_M_replace
                  ((ulong)&this->ExecutableSuffix,0,
                   (char *)(this->ExecutableSuffix)._M_string_length,(ulong)pcVar8);
      }
      else {
        iVar7 = std::__cxx11::string::compare(local_258);
        if (iVar7 == 0) {
          pcVar8 = ".exe";
          goto LAB_0016722d;
        }
        iVar7 = std::__cxx11::string::compare(local_258);
        if (iVar7 == 0) {
          pcVar8 = ".app";
          goto LAB_0016722d;
        }
        std::__cxx11::string::_M_assign((string *)&this->ExecutableSuffix);
      }
      local_228._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"CPACK_IFW_PACKAGE_FILE_EXTENSION","");
      pcVar8 = cmCPackIFWCommon::GetOption(this_00,&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (pcVar8 == (char *)0x0) {
        iVar7 = std::__cxx11::string::compare(local_258);
        if (iVar7 == 0) {
          pcVar8 = ".dmg";
          goto LAB_00167293;
        }
        std::__cxx11::string::_M_assign((string *)&this->OutputExtension);
      }
      else {
        strlen(pcVar8);
LAB_00167293:
        std::__cxx11::string::_M_replace
                  ((ulong)&this->OutputExtension,0,(char *)(this->OutputExtension)._M_string_length,
                   (ulong)pcVar8);
      }
      if ((this->OutputExtension)._M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)&this->OutputExtension,0,(char *)0x0,0x4cfe30);
      }
      iVar7 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
      if ((string *)local_258._0_8_ != psVar4) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      goto LAB_00167340;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
               ,0x61);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      uVar5 = local_258._0_8_;
      sVar10 = strlen((char *)local_258._0_8_);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x153,(char *)uVar5,sVar10);
      goto LAB_001670bd;
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar7 = 0;
LAB_00167340:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return iVar7;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";
  const std::string FrameworkVersionOpt = "CPACK_IFW_FRAMEWORK_VERSION";

  if (!this->IsSet(BinCreatorOpt) || !this->IsSet(RepoGenOpt) ||
      !this->IsSet(FrameworkVersionOpt)) {
    this->ReadListFile("CPackIFW.cmake");
  }

  // Look 'binarycreator' executable (needs)

  const char* BinCreatorStr = this->GetOption(BinCreatorOpt);
  if (!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr)) {
    this->BinCreator.clear();
  } else {
    this->BinCreator = BinCreatorStr;
  }

  if (this->BinCreator.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW compiler \"binarycreator\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Look 'repogen' executable (optional)

  const char* RepoGenStr = this->GetOption(RepoGenOpt);
  if (!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr)) {
    this->RepoGen.clear();
  } else {
    this->RepoGen = RepoGenStr;
  }

  // Framework version
  if (const char* FrameworkVersionSrt = this->GetOption(FrameworkVersionOpt)) {
    this->FrameworkVersion = FrameworkVersionSrt;
  } else {
    this->FrameworkVersion = "1.9.9";
  }

  // Variables that Change Behavior

  // Resolve duplicate names
  this->ResolveDuplicateNames =
    this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  this->PkgsDirsVector.clear();
  if (const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->PkgsDirsVector);
  }

  // Additional repositories dirs
  this->RepoDirsVector.clear();
  if (const char* dirs =
        this->GetOption("CPACK_IFW_REPOSITORIES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->RepoDirsVector);
  }

  // Installer
  this->Installer.Generator = this;
  this->Installer.ConfigureFromOptions();

  // Repository
  this->Repository.Generator = this;
  this->Repository.Name = "Unspecified";
  if (const char* site = this->GetOption("CPACK_DOWNLOAD_SITE")) {
    this->Repository.Url = site;
    this->Installer.RemoteRepositories.push_back(&this->Repository);
  }

  // Repositories
  if (const char* RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL")) {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr, RepoAllVector);
    for (std::string const& r : RepoAllVector) {
      this->GetRepository(r);
    }
  }

  if (const char* ifwDownloadAll = this->GetOption("CPACK_IFW_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
  } else if (const char* cpackDownloadAll =
               this->GetOption("CPACK_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
  } else {
    this->OnlineOnly = false;
  }

  if (!this->Installer.RemoteRepositories.empty() && this->RepoGen.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW repository generator \"repogen\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Executable suffix
  std::string exeSuffix(this->GetOption("CMAKE_EXECUTABLE_SUFFIX"));
  std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
  if (sysName == "Linux") {
    this->ExecutableSuffix = ".run";
  } else if (sysName == "Windows") {
    this->ExecutableSuffix = ".exe";
  } else if (sysName == "Darwin") {
    this->ExecutableSuffix = ".app";
  } else {
    this->ExecutableSuffix = exeSuffix;
  }

  // Output extension
  if (const char* optOutExt =
        this->GetOption("CPACK_IFW_PACKAGE_FILE_EXTENSION")) {
    this->OutputExtension = optOutExt;
  } else if (sysName == "Darwin") {
    this->OutputExtension = ".dmg";
  } else {
    this->OutputExtension = this->ExecutableSuffix;
  }
  if (this->OutputExtension.empty()) {
    this->OutputExtension = this->cmCPackGenerator::GetOutputExtension();
  }

  return this->Superclass::InitializeInternal();
}